

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O1

bool __thiscall llvm::Triple::getMacOSXVersion(Triple *this,uint *Major,uint *Minor,uint *Micro)

{
  OSType OVar1;
  bool bVar2;
  
  getOSVersion(this,Major,Minor,Micro);
  OVar1 = this->OS;
  if ((int)OVar1 < 0x1b) {
    if (OVar1 == Darwin) {
      if (*Major == 0) {
        *Major = 8;
      }
      if (3 < *Major) {
        *Micro = 0;
        *Minor = *Major - 4;
        *Major = 10;
        goto LAB_0018edff;
      }
    }
    else {
      if (OVar1 == IOS) goto LAB_0018edeb;
      if (OVar1 != MacOSX) goto LAB_0018ee38;
      if (*Major == 0) {
        *Major = 10;
        *Minor = 4;
      }
      if (*Major == 10) goto LAB_0018edff;
    }
    bVar2 = false;
  }
  else {
    if (1 < OVar1 - TvOS) {
LAB_0018ee38:
      llvm_unreachable_internal
                ("unexpected OS for Darwin triple",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
                 ,0x407);
    }
LAB_0018edeb:
    *Major = 10;
    *Minor = 4;
    *Micro = 0;
LAB_0018edff:
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool Triple::getMacOSXVersion(unsigned &Major, unsigned &Minor,
                              unsigned &Micro) const {
  getOSVersion(Major, Minor, Micro);

  switch (getOS()) {
  default: llvm_unreachable("unexpected OS for Darwin triple");
  case Darwin:
    // Default to darwin8, i.e., MacOSX 10.4.
    if (Major == 0)
      Major = 8;
    // Darwin version numbers are skewed from OS X versions.
    if (Major < 4)
      return false;
    Micro = 0;
    Minor = Major - 4;
    Major = 10;
    break;
  case MacOSX:
    // Default to 10.4.
    if (Major == 0) {
      Major = 10;
      Minor = 4;
    }
    if (Major != 10)
      return false;
    break;
  case IOS:
  case TvOS:
  case WatchOS:
    // Ignore the version from the triple.  This is only handled because the
    // the clang driver combines OS X and IOS support into a common Darwin
    // toolchain that wants to know the OS X version number even when targeting
    // IOS.
    Major = 10;
    Minor = 4;
    Micro = 0;
    break;
  }
  return true;
}